

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testCompositeDeepScanLine.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_604d5::data<Imath_3_2::half>::setUpFrameBuffer
          (data<Imath_3_2::half> *this,
          vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_> *data,FrameBuffer *framebuf,
          Box2i *dw,bool dontbotherloadingdepth)

{
  PixelType PVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  char *pcVar5;
  bool bVar6;
  size_type sVar7;
  Slice *pSVar8;
  long lVar9;
  size_type sVar10;
  size_type sVar11;
  int *in_RCX;
  char *in_RDX;
  vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_> *in_RSI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  byte in_R8B;
  intptr_t base;
  size_t i;
  undefined4 in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffeec;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  size_type in_stack_ffffffffffffff08;
  vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_> *in_stack_ffffffffffffff10;
  reference pvVar12;
  int local_90;
  int local_88;
  Slice local_80 [56];
  reference local_48;
  ulong local_40;
  byte local_21;
  int *local_20;
  char *local_18;
  vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_> *local_10;
  
  local_21 = in_R8B & 1;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::size(in_RDI);
  Imath_3_2::Box<Imath_3_2::Vec2<int>_>::size
            ((Box<Imath_3_2::Vec2<int>_> *)
             CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  Imath_3_2::Box<Imath_3_2::Vec2<int>_>::size
            ((Box<Imath_3_2::Vec2<int>_> *)
             CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>::resize
            (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  local_40 = 0;
  do {
    uVar4 = local_40;
    sVar7 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(in_RDI);
    if (sVar7 <= uVar4) {
      return;
    }
    if ((local_21 & 1) == 0) {
LAB_0014eb23:
      local_48 = std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>::operator[]
                           (local_10,local_40);
      pcVar5 = local_18;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](in_RDI,local_40);
      pSVar8 = (Slice *)std::__cxx11::string::c_str();
      PVar1 = *(PixelType *)
               &in_RDI[6].
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      iVar2 = *local_20;
      iVar3 = local_20[1];
      pvVar12 = local_48;
      Imath_3_2::Box<Imath_3_2::Vec2<int>_>::size
                ((Box<Imath_3_2::Vec2<int>_> *)
                 CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      lVar9 = (long)(iVar2 + iVar3 * (local_88 + 1)) << 1;
      sVar7 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(in_RDI);
      sVar10 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::size(in_RDI);
      Imath_3_2::Box<Imath_3_2::Vec2<int>_>::size
                ((Box<Imath_3_2::Vec2<int>_> *)
                 CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      sVar11 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::size(in_RDI);
      in_stack_fffffffffffffee8 = 1;
      in_stack_fffffffffffffef0 = 0;
      in_stack_fffffffffffffef8 = 0;
      Imf_3_2::Slice::Slice
                (local_80,PVar1,(char *)((long)pvVar12 - lVar9 * sVar7),sVar10 << 1,
                 (long)(local_90 + 1) * 2 * sVar11,1,1,0.0,false,false);
      Imf_3_2::FrameBuffer::insert(pcVar5,pSVar8);
    }
    else {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](in_RDI,local_40);
      bVar6 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                              (char *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8))
      ;
      if (bVar6) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](in_RDI,local_40);
        bVar6 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                                (char *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8
                                                ));
        if (bVar6) goto LAB_0014eb23;
      }
    }
    local_40 = local_40 + 1;
  } while( true );
}

Assistant:

void setUpFrameBuffer (
        vector<T>&   data,
        FrameBuffer& framebuf,
        const Box2i& dw,
        bool         dontbotherloadingdepth) const
    {

        // allocate enough space for all channels (even the depth channel)
        data.resize (
            _channels.size () * (dw.size ().x + 1) * (dw.size ().y + 1));
        for (size_t i = 0; i < _channels.size (); i++)
        {
            if (!dontbotherloadingdepth ||
                (_channels[i] != "Z" && _channels[i] != "ZBack"))
            {
                intptr_t base = reinterpret_cast<intptr_t> (&data[i]);
                framebuf.insert (
                    _channels[i].c_str (),
                    Slice (
                        _type,
                        reinterpret_cast<char*> (
                            base -
                            sizeof (T) *
                                (dw.min.x + dw.min.y * (dw.size ().x + 1)) *
                                _channels.size ()),
                        sizeof (T) * _channels.size (),
                        sizeof (T) * (dw.size ().x + 1) * _channels.size ()));
            }
        }
    }